

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

size_t __thiscall Fossilize::ConcurrentDatabase::get_total_num_hashes(ConcurrentDatabase *this)

{
  size_t sVar1;
  undefined4 local_1c;
  ResourceTag tag;
  uint i;
  size_t count;
  ConcurrentDatabase *this_local;
  
  _tag = 0;
  for (local_1c = RESOURCE_APPLICATION_INFO; local_1c < RESOURCE_COUNT;
      local_1c = local_1c + RESOURCE_SAMPLER) {
    sVar1 = get_total_num_hashes_for_tag(this,local_1c);
    _tag = sVar1 + _tag;
  }
  return _tag;
}

Assistant:

size_t get_total_num_hashes() const
	{
		size_t count = 0;
		for (unsigned i = 0; i < RESOURCE_COUNT; i++)
		{
			auto tag = ResourceTag(i);
			count += get_total_num_hashes_for_tag(tag);
		}
		return count;
	}